

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

bool __thiscall
upb::generator::reflection::ReflectionGenerator::GenerateAll
          (ReflectionGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  pointer ppFVar1;
  FileDescriptor *file;
  bool bVar2;
  FileDefPtr file_00;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *context;
  pointer ppFVar3;
  string_view parameter_00;
  Options options;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_seen;
  Arena local_a8;
  DefPoolPair local_98;
  Options local_78;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_78.dllexport_decl._M_dataplus._M_p = (pointer)&local_78.dllexport_decl.field_2;
  local_78.dllexport_decl._M_string_length = 0;
  local_78.dllexport_decl.field_2._M_local_buf[0] = '\0';
  parameter_00._M_str = (parameter->_M_dataplus)._M_p;
  parameter_00._M_len = parameter->_M_string_length;
  bVar2 = ParseOptions(parameter_00,&local_78,error);
  if (bVar2) {
    local_a8.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
    super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
    super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl =
         upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
    local_a8.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
    super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
    super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.
    super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
    DefPoolPair::DefPoolPair(&local_98);
    local_58.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    local_58.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_58.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    ppFVar3 = (files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar3 != ppFVar1) {
      do {
        file = *ppFVar3;
        context = &local_58;
        PopulateDefPool(file,&local_a8,&local_98,
                        (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_58);
        file_00.ptr_ = upb_DefPool_FindFileByName
                                 (local_98.pool64_.ptr_._M_t.
                                  super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                                  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                                  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,
                                  (file->name_->_M_dataplus)._M_p);
        GenerateReflectionHeader(file_00,&local_78,generator_context);
        GenerateReflectionSource
                  ((reflection *)file_00.ptr_,(upb_FileDef *)&local_78,(Options *)generator_context,
                   (GeneratorContext *)context);
        ppFVar3 = ppFVar3 + 1;
      } while (ppFVar3 != ppFVar1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set(&local_58);
    if (local_98.pool64_.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
        super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
        super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl != (upb_DefPool *)0x0) {
      (*(code *)local_98.pool64_.ptr_._M_t.
                super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
                super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false>._M_head_impl)
                (local_98.pool64_.ptr_._M_t.
                 super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                 super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl);
    }
    local_98.pool64_.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
    super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
    super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = (upb_DefPool *)0x0;
    if (local_98.pool32_.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
        super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
        super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl != (upb_DefPool *)0x0) {
      (*(code *)local_98.pool32_.ptr_._M_t.
                super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
                super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false>._M_head_impl)
                (local_98.pool32_.ptr_._M_t.
                 super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                 super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl);
    }
    if (local_a8.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
        super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
        super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl != (upb_Arena *)0x0) {
      (*(code *)local_a8.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.
                super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>._M_head_impl)
                (local_a8.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                 super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.dllexport_decl._M_dataplus._M_p != &local_78.dllexport_decl.field_2) {
    operator_delete(local_78.dllexport_decl._M_dataplus._M_p,
                    CONCAT71(local_78.dllexport_decl.field_2._M_allocated_capacity._1_7_,
                             local_78.dllexport_decl.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool GenerateAll(const std::vector<const google::protobuf::FileDescriptor*>& files,
                   const std::string& parameter,
                   google::protobuf::compiler::GeneratorContext* generator_context,
                   std::string* error) const override {
    Options options;
    if (!ParseOptions(parameter, &options, error)) {
      return false;
    }

    upb::Arena arena;
    DefPoolPair pools;
    absl::flat_hash_set<std::string> files_seen;
    for (const auto* file : files) {
      PopulateDefPool(file, &arena, &pools, &files_seen);
      upb::FileDefPtr upb_file = pools.GetFile(file->name());
      GenerateFile(upb_file, options, generator_context);
    }

    return true;
  }